

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncRegExMatch(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  string *psVar2;
  regex_error *anon_var_0;
  bool found;
  undefined1 local_50 [8];
  regex regex;
  StringLiteral *regexString;
  StringLiteral *source;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  source = (StringLiteral *)parameters;
  parameters_local = (vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)funcName;
  funcName_local = (Identifier *)__return_storage_ptr__;
  bVar1 = getExpFuncParameter(parameters,0,&regexString,funcName,false);
  if (bVar1) {
    bVar1 = getExpFuncParameter((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)source,
                                1,(StringLiteral **)
                                  &regex._M_automaton.
                                   super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount,(Identifier *)parameters_local,false);
    if (bVar1) {
      psVar2 = StringLiteral::string_abi_cxx11_
                         ((StringLiteral *)
                          regex._M_automaton.
                          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_50,psVar2,0x10);
      psVar2 = StringLiteral::string_abi_cxx11_(regexString);
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (psVar2,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,0);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,(ulong)bVar1);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50);
    }
    else {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRegExMatch(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* source;
	const StringLiteral* regexString;

	GET_PARAM(parameters,0,source);
	GET_PARAM(parameters,1,regexString);

#if ARMIPS_EXCEPTIONS
	try
	{
#endif
		std::regex regex(regexString->string());
		bool found = std::regex_match(source->string(),regex);
		return ExpressionValue(found ? INT64_C(1) : INT64_C(0));
#if ARMIPS_EXCEPTIONS
	} catch (std::regex_error&)
	{
		Logger::queueError(Logger::Error, "Invalid regular expression");
		return ExpressionValue();
	}
#endif
}